

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.h
# Opt level: O0

void __thiscall
Js::CompoundString::Builder<256U>::AppendSlow
          (Builder<256U> *this,char16 *s,CharCount appendCharLength)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  CompoundString *toString;
  CompoundString *compoundString;
  CharCount appendCharLength_local;
  char16 *s_local;
  Builder<256U> *this_local;
  
  if (this->compoundString != (CompoundString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x263,"(!this->compoundString)","!this->compoundString");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  toString = CreateCompoundString(this,true);
  this->compoundString = toString;
  bVar2 = TryAppendGeneric<Js::CompoundString>(s,appendCharLength,toString);
  if (!bVar2) {
    CompoundString::AppendSlow(toString,s,appendCharLength);
  }
  return;
}

Assistant:

void CompoundString::Builder<MinimumCharCapacity>::AppendSlow(
        __in_xcount(appendCharLength) const char16 *const s,
        const CharCount appendCharLength)
    {
        // Even though CreateCompoundString() will create a compound string with some additional space reserved for appending,
        // the amount of space available may still not be enough, so need to check and fall back to the slow path as well
        Assert(!this->compoundString);
        CompoundString *const compoundString = CreateCompoundString(true);
        this->compoundString = compoundString;
        if(TryAppendGeneric(s, appendCharLength, compoundString))
            return;
        compoundString->AppendSlow(s, appendCharLength);
    }